

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FixSelect(DbFixer *pFix,Select *pSelect)

{
  int iVar1;
  int local_24;
  Select *pSStack_20;
  int i;
  Select *pSelect_local;
  DbFixer *pFix_local;
  
  pSStack_20 = pSelect;
  while( true ) {
    if (pSStack_20 == (Select *)0x0) {
      return 0;
    }
    iVar1 = sqlite3FixExprList(pFix,pSStack_20->pEList);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = sqlite3FixSrcList(pFix,pSStack_20->pSrc);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = sqlite3FixExpr(pFix,pSStack_20->pWhere);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = sqlite3FixExprList(pFix,pSStack_20->pGroupBy);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = sqlite3FixExpr(pFix,pSStack_20->pHaving);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = sqlite3FixExprList(pFix,pSStack_20->pOrderBy);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = sqlite3FixExpr(pFix,pSStack_20->pLimit);
    if (iVar1 != 0) break;
    if (pSStack_20->pWith != (With *)0x0) {
      for (local_24 = 0; local_24 < pSStack_20->pWith->nCte; local_24 = local_24 + 1) {
        iVar1 = sqlite3FixSelect(pFix,pSStack_20->pWith->a[local_24].pSelect);
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    pSStack_20 = pSStack_20->pPrior;
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixSelect(
  DbFixer *pFix,       /* Context of the fixation */
  Select *pSelect      /* The SELECT statement to be fixed to one database */
){
  while( pSelect ){
    if( sqlite3FixExprList(pFix, pSelect->pEList) ){
      return 1;
    }
    if( sqlite3FixSrcList(pFix, pSelect->pSrc) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pWhere) ){
      return 1;
    }
    if( sqlite3FixExprList(pFix, pSelect->pGroupBy) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pHaving) ){
      return 1;
    }
    if( sqlite3FixExprList(pFix, pSelect->pOrderBy) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pLimit) ){
      return 1;
    }
    if( pSelect->pWith ){
      int i;
      for(i=0; i<pSelect->pWith->nCte; i++){
        if( sqlite3FixSelect(pFix, pSelect->pWith->a[i].pSelect) ){
          return 1;
        }
      }
    }
    pSelect = pSelect->pPrior;
  }
  return 0;
}